

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uname.cpp
# Opt level: O3

int fs_is_wsl(void)

{
  int iVar1;
  utsname buf;
  utsname local_186;
  
  iVar1 = uname(&local_186);
  return -(uint)(iVar1 != 0);
}

Assistant:

int fs_is_wsl()
{

#ifdef HAVE_UTSNAME
  struct utsname buf;
  if (uname(&buf) != 0)
    return -1;

  std::string_view s(buf.sysname);
  std::string_view r(buf.release);

  if(s != "Linux")
    return 0;
#ifdef __cpp_lib_starts_ends_with // C++20
  if (r.ends_with("microsoft-standard-WSL2"))
    return 2;
  if (r.ends_with("-Microsoft"))
    return 1;
#endif
#endif
  return 0;
}